

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

int tjDestroy(tjhandle handle)

{
  int iVar1;
  void *in_RDI;
  long *in_FS_OFFSET;
  j_decompress_ptr dinfo;
  j_compress_ptr cinfo;
  tjinstance *this;
  int local_4;
  
  if (in_RDI == (void *)0x0) {
    snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"Invalid handle");
    local_4 = -1;
  }
  else {
    *(undefined4 *)((long)in_RDI + 0x5f8) = 0;
    *(undefined4 *)((long)in_RDI + 0x6d0) = 0;
    iVar1 = _setjmp((__jmp_buf_tag *)((long)in_RDI + 0x528));
    if (iVar1 == 0) {
      if ((*(uint *)((long)in_RDI + 0x600) & 1) != 0) {
        jpeg_destroy_compress((j_compress_ptr)0x10c757);
      }
      if ((*(uint *)((long)in_RDI + 0x600) & 2) != 0) {
        jpeg_destroy_decompress((j_decompress_ptr)0x10c773);
      }
      free(in_RDI);
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

DLLEXPORT int tjDestroy(tjhandle handle)
{
  GET_INSTANCE(handle);

  if (setjmp(this->jerr.setjmp_buffer)) return -1;
  if (this->init & COMPRESS) jpeg_destroy_compress(cinfo);
  if (this->init & DECOMPRESS) jpeg_destroy_decompress(dinfo);
  free(this);
  return 0;
}